

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O0

double delaunator::sum(vector<double,_std::allocator<double>_> *x)

{
  const_reference pvVar1;
  double dVar2;
  undefined8 local_48;
  double m;
  double k;
  size_t i;
  double err;
  double sum;
  vector<double,_std::allocator<double>_> *x_local;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](x,0);
  i = 0;
  k = 4.94065645841247e-324;
  err = *pvVar1;
  while( true ) {
    dVar2 = (double)std::vector<double,_std::allocator<double>_>::size(x);
    if ((ulong)dVar2 <= (ulong)k) break;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](x,(size_type)k);
    local_48 = *pvVar1;
    dVar2 = err + local_48;
    if (ABS(err) < ABS(local_48)) {
      local_48 = (local_48 - dVar2) + err;
    }
    else {
      local_48 = (err - dVar2) + local_48;
    }
    i = (size_t)(local_48 + (double)i);
    k = (double)((long)k + 1);
    err = dVar2;
  }
  return err + (double)i;
}

Assistant:

inline double sum(const std::vector<double>& x) {
    double sum = x[0];
    double err = 0.0;

    for (size_t i = 1; i < x.size(); i++) {
        const double k = x[i];
        const double m = sum + k;
        err += std::fabs(sum) >= std::fabs(k) ? sum - m + k : k - m + sum;
        sum = m;
    }
    return sum + err;
}